

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configreader.cpp
# Opt level: O0

bool __thiscall ConfigReader::parseDesignName(ConfigReader *this)

{
  allocator<char> local_b9;
  string local_b8;
  undefined4 local_98;
  allocator<char> local_91;
  string local_90;
  token_t local_5c;
  undefined1 local_58 [4];
  token_t tok;
  string designName;
  string tokstr;
  ConfigReader *this_local;
  
  std::__cxx11::string::string((string *)(designName.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_58);
  local_5c = tokenize(this,(string *)local_58);
  if (local_5c == TOK_IDENT) {
    local_5c = tokenize(this,(string *)((long)&designName.field_2 + 8));
    if (local_5c == TOK_SEMICOL) {
      (*this->_vptr_ConfigReader[9])(this,local_58);
      this_local._7_1_ = true;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"Expected ;\n",&local_b9);
      error(this,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator(&local_b9);
      this_local._7_1_ = false;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"Expected a design name\n",&local_91);
    error(this,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
    this_local._7_1_ = false;
  }
  local_98 = 1;
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(designName.field_2._M_local_buf + 8));
  return this_local._7_1_;
}

Assistant:

bool ConfigReader::parseDesignName()
{
    // DESIGN: designname
    std::string tokstr;
    std::string designName;

    // designname
    ConfigReader::token_t tok = tokenize(designName);
    if (tok != TOK_IDENT)
    {
        error("Expected a design name\n");
        return false;
    }

    // expect semicol
    tok = tokenize(tokstr);
    if (tok != TOK_SEMICOL)
    {
        error("Expected ;\n");
        return false;
    }

    onDesignName(designName);
    return true;
}